

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * google::protobuf::internal::
       ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                 (char *ptr,char *end,anon_class_32_4_91646d40 add)

{
  byte bVar1;
  int number;
  undefined1 auVar3 [16];
  int i;
  long lVar4;
  EnumDescriptor *this;
  EnumValueDescriptor *pEVar5;
  UnknownFieldSet *this_00;
  int number_00;
  pair<const_char_*,_unsigned_long> pVar6;
  undefined1 auVar2 [12];
  
  if (ptr < end) {
    do {
      lVar4 = 0;
      do {
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      bVar1 = *ptr;
      if ((long)(char)bVar1 < 0) {
        pVar6 = VarintParseSlow64(ptr,(uint)bVar1);
        auVar2 = pVar6._0_12_;
        if (pVar6.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        auVar3._8_8_ = (long)(char)bVar1;
        auVar3._0_8_ = (byte *)ptr + 1;
        auVar2 = auVar3._0_12_;
      }
      ptr = auVar2._0_8_;
      this = FieldDescriptor::enum_type(add.field);
      number_00 = auVar2._8_4_;
      pEVar5 = EnumDescriptor::FindValueByNumber(this,number_00);
      if (pEVar5 == (EnumValueDescriptor *)0x0) {
        number = (add.field)->number_;
        this_00 = Reflection::MutableUnknownFields(add.reflection,add.msg);
        UnknownFieldSet::AddVarint(this_00,number,(long)number_00);
      }
      else {
        RepeatedField<int>::Add(add.rep_enum,number_00);
      }
    } while (ptr < end);
  }
  return (char *)(byte *)ptr;
}

Assistant:

const char* ReadPackedVarintArray(const char* ptr, const char* end, Add add) {
  while (ptr < end) {
    uint64_t varint;
    ptr = VarintParse(ptr, &varint);
    if (ptr == nullptr) return nullptr;
    add(varint);
  }
  return ptr;
}